

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

IntVect __thiscall amrex::BATransformer::coarsen_ratio(BATransformer *this)

{
  undefined8 uVar2;
  int iVar3;
  undefined4 *in_RDI;
  IntVect IVar1;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 local_68;
  int local_60;
  undefined8 local_58;
  int local_50;
  undefined8 local_48;
  int local_40;
  undefined8 local_38;
  int local_30;
  undefined8 local_28;
  int local_20;
  undefined8 local_c;
  int local_4;
  
  switch(*in_RDI) {
  case 0:
    IVar1 = BATnull::coarsen_ratio
                      ((BATnull *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_28 = IVar1.vect._0_8_;
    local_c = local_28;
    local_20 = IVar1.vect[2];
    local_4 = local_20;
    break;
  case 1:
    IVar1 = BATindexType::coarsen_ratio
                      ((BATindexType *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      );
    local_38 = IVar1.vect._0_8_;
    local_c = local_38;
    local_30 = IVar1.vect[2];
    local_4 = local_30;
    break;
  case 2:
    IVar1 = BATcoarsenRatio::coarsen_ratio((BATcoarsenRatio *)(in_RDI + 1));
    local_48 = IVar1.vect._0_8_;
    local_c = local_48;
    local_40 = IVar1.vect[2];
    local_4 = local_40;
    break;
  case 3:
    IVar1 = BATindexType_coarsenRatio::coarsen_ratio((BATindexType_coarsenRatio *)(in_RDI + 1));
    local_58 = IVar1.vect._0_8_;
    local_c = local_58;
    local_50 = IVar1.vect[2];
    local_4 = local_50;
    break;
  default:
    IVar1 = BATbndryReg::coarsen_ratio((BATbndryReg *)(in_RDI + 1));
    local_68 = IVar1.vect._0_8_;
    local_c = local_68;
    local_60 = IVar1.vect[2];
    local_4 = local_60;
  }
  IVar1.vect[0] = (undefined4)local_c;
  uVar2._4_4_ = local_c._4_4_;
  register0x00000010 = local_4;
  return (IntVect)IVar1.vect;
}

Assistant:

IntVect coarsen_ratio () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.coarsen_ratio();
        case     BATType::indexType:
            return m_op.m_indexType.coarsen_ratio();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.coarsen_ratio();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.coarsen_ratio();
        default:
            return m_op.m_bndryReg.coarsen_ratio();
        }
    }